

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oaa.cc
# Opt level: O2

void predict_or_learn<true,true,false,false>(oaa *o,single_learner *base,example *ec)

{
  polyprediction *ppVar1;
  float fVar2;
  int iVar3;
  _func_void_int_string_v_array<char> *p_Var4;
  v_array<char> vVar5;
  ulong uVar6;
  ostream *poVar7;
  uint uVar8;
  ulong uVar9;
  uint32_t i_1;
  uint uVar10;
  uint uVar11;
  undefined8 in_stack_fffffffffffffe18;
  uint uVar12;
  float fVar13;
  undefined1 in_stack_fffffffffffffe28 [16];
  stringstream outputStringStream;
  ostream local_1a8;
  
  uVar12 = (ec->l).multi.label;
  fVar13 = (ec->l).simple.weight;
  if (((ulong)uVar12 == 0) || ((uVar12 != 0xffffffff && (o->k < (ulong)uVar12)))) {
    poVar7 = std::operator<<((ostream *)&std::cout,"label ");
    poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
    poVar7 = std::operator<<(poVar7," is not in {1,");
    poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
    poVar7 = std::operator<<(poVar7,"} This won\'t work right.");
    std::endl<char,std::char_traits<char>>(poVar7);
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&outputStringStream);
  (ec->l).cs.costs._begin = (wclass *)0x7f7fffff;
  (ec->l).simple.initial = 0.0;
  LEARNER::learner<char,_example>::multipredict(base,ec,0,o->k,o->pred,true);
  uVar6 = o->k;
  uVar11 = 1;
  for (uVar8 = 2; uVar8 <= uVar6; uVar8 = uVar8 + 1) {
    fVar2 = o->pred[uVar8 - 1].scalar;
    ppVar1 = o->pred + (uVar11 - 1);
    uVar10 = uVar8;
    if (fVar2 < ppVar1->scalar || fVar2 == ppVar1->scalar) {
      uVar10 = uVar11;
    }
    uVar11 = uVar10;
  }
  if (ec->passthrough != (features *)0x0) {
    uVar8 = 0;
    while( true ) {
      uVar10 = uVar8 + 1;
      if (uVar6 < uVar10) break;
      add_passthrough_feature_magic(ec,0x398d4541,(ulong)uVar10,o->pred[uVar8].scalar);
      uVar6 = o->k;
      uVar8 = uVar10;
    }
  }
  uVar9 = 1;
  while (uVar8 = (uint)uVar9, uVar9 <= uVar6) {
    (ec->l).simple.label = *(float *)(&DAT_00238c58 + (ulong)(uVar12 == uVar8) * 4);
    *(undefined8 *)((long)&(ec->l).cs.costs._begin + 4) = 0;
    (ec->pred).scalar = o->pred[uVar8 - 1].scalar;
    LEARNER::learner<char,_example>::update(base,ec,(ulong)(uVar8 - 1));
    uVar6 = o->k;
    uVar9 = (ulong)(uVar8 + 1);
  }
  poVar7 = std::operator<<(&local_1a8,"1:");
  std::ostream::operator<<(poVar7,o->pred->scalar);
  uVar6 = 1;
  while (uVar9 = (ulong)((int)uVar6 + 1), uVar9 <= o->k) {
    poVar7 = std::operator<<(&local_1a8,' ');
    poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
    poVar7 = std::operator<<(poVar7,':');
    std::ostream::operator<<(poVar7,o->pred[uVar6].scalar);
    uVar6 = uVar9;
  }
  p_Var4 = o->all->print_text;
  iVar3 = o->all->raw_prediction;
  std::__cxx11::stringbuf::str();
  vVar5._end._0_4_ = uVar12;
  vVar5._begin = (char *)in_stack_fffffffffffffe18;
  vVar5._end._4_4_ = fVar13;
  vVar5.end_array = (char *)in_stack_fffffffffffffe28._0_8_;
  vVar5.erase_count = in_stack_fffffffffffffe28._8_8_;
  (*p_Var4)(iVar3,(string)ec->tag,vVar5);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffe28);
  (ec->pred).multiclass = uVar11;
  (ec->l).multi.label = uVar12;
  (ec->l).simple.weight = fVar13;
  std::__cxx11::stringstream::~stringstream((stringstream *)&outputStringStream);
  return;
}

Assistant:

void predict_or_learn(oaa& o, LEARNER::single_learner& base, example& ec)
{
  MULTICLASS::label_t mc_label_data = ec.l.multi;
  if (mc_label_data.label == 0 || (mc_label_data.label > o.k && mc_label_data.label != (uint32_t)-1))
    cout << "label " << mc_label_data.label << " is not in {1," << o.k << "} This won't work right." << endl;

  stringstream outputStringStream;
  uint32_t prediction = 1;
  v_array<float> scores_array;
  if (scores)
    scores_array = ec.pred.scalars;

  ec.l.simple = {FLT_MAX, 0.f, 0.f};
  base.multipredict(ec, 0, o.k, o.pred, true);
  for (uint32_t i = 2; i <= o.k; i++)
    if (o.pred[i - 1].scalar > o.pred[prediction - 1].scalar)
      prediction = i;

  if (ec.passthrough)
    for (uint32_t i = 1; i <= o.k; i++) add_passthrough_feature(ec, i, o.pred[i - 1].scalar);

  if (is_learn)
  {
    for (uint32_t i = 1; i <= o.k; i++)
    {
      ec.l.simple = {(mc_label_data.label == i) ? 1.f : -1.f, 0.f, 0.f};
      ec.pred.scalar = o.pred[i - 1].scalar;
      base.update(ec, i - 1);
    }
  }

  if (print_all)
  {
    outputStringStream << "1:" << o.pred[0].scalar;
    for (uint32_t i = 2; i <= o.k; i++) outputStringStream << ' ' << i << ':' << o.pred[i - 1].scalar;
    o.all->print_text(o.all->raw_prediction, outputStringStream.str(), ec.tag);
  }

  if (scores)
  {
    scores_array.clear();
    for (uint32_t i = 0; i < o.k; i++) scores_array.push_back(o.pred[i].scalar);
    ec.pred.scalars = scores_array;

    if (probabilities)
    {
      float sum_prob = 0;
      for (uint32_t i = 0; i < o.k; i++)
      {
        ec.pred.scalars[i] = 1.f / (1.f + correctedExp(-o.pred[i].scalar));
        sum_prob += ec.pred.scalars[i];
      }
      float inv_sum_prob = 1.f / sum_prob;
      for (uint32_t i = 0; i < o.k; i++) ec.pred.scalars[i] *= inv_sum_prob;
    }
  }
  else
    ec.pred.multiclass = prediction;

  ec.l.multi = mc_label_data;
}